

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Sendrecv_replace
              (void *buf,int count,MPIABI_Datatype datatype,int dest,int sendtag,int source,
              int recvtag,MPIABI_Comm comm,MPIABI_Status *status)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ompi_datatype_t *poVar4;
  ompi_communicator_t *poVar5;
  MPI_Status *pMVar6;
  WPI_StatusPtr local_50;
  WPI_Handle local_48 [8];
  WPI_Handle local_40 [12];
  int local_34;
  int local_30;
  int source_local;
  int sendtag_local;
  int dest_local;
  MPIABI_Datatype datatype_local;
  void *pvStack_18;
  int count_local;
  void *buf_local;
  
  local_34 = source;
  local_30 = sendtag;
  source_local = dest;
  _sendtag_local = datatype;
  datatype_local._4_4_ = count;
  pvStack_18 = buf;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle((WPI_Handle<ompi_datatype_t_*> *)local_40,datatype);
  poVar4 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_40);
  iVar2 = source_local;
  iVar1 = local_30;
  iVar3 = local_34;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle((WPI_Handle<ompi_communicator_t_*> *)local_48,comm);
  poVar5 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_48);
  WPI_StatusPtr::WPI_StatusPtr(&local_50,status);
  pMVar6 = WPI_StatusPtr::operator_cast_to_ompi_status_public_t_(&local_50);
  iVar3 = MPI_Sendrecv_replace(buf,count,poVar4,iVar2,iVar1,iVar3,recvtag,poVar5,pMVar6);
  WPI_StatusPtr::~WPI_StatusPtr(&local_50);
  return iVar3;
}

Assistant:

int MPIABI_Sendrecv_replace(
  void * buf,
  int count,
  MPIABI_Datatype datatype,
  int dest,
  int sendtag,
  int source,
  int recvtag,
  MPIABI_Comm comm,
  MPIABI_Status * status
) {
  return MPI_Sendrecv_replace(
    buf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    dest,
    sendtag,
    source,
    recvtag,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}